

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_perf.c
# Opt level: O3

attr_list INT_CMtest_transport(CMConnection conn,attr_list how)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  char *pcVar5;
  size_t sVar6;
  FFSEncodeVector pFVar7;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  undefined4 *puVar11;
  FFSEncodeVector full_vec;
  pthread_t pVar12;
  long lVar13;
  undefined4 uVar14;
  FFSEncodeVector pFVar15;
  CManager cm;
  FILE *pFVar16;
  ulong uVar17;
  size_t *psVar18;
  ulong uVar19;
  FFSEncodeVector __ptr;
  int vecs;
  int repeat_count;
  int reuse_write_buffer;
  ssize_t size;
  attr_list result;
  int node_id;
  int verbose;
  int header [6];
  timespec ts;
  uint local_ac;
  uint local_a8;
  int local_a4;
  size_t local_a0;
  attr_list local_98;
  FFSEncodeVector local_90;
  int local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined8 local_74;
  int local_6c;
  undefined8 local_68;
  CManager local_58;
  FFSEncodeVector local_50;
  CMConnection local_48;
  timespec local_40;
  
  local_98 = (attr_list)0x0;
  local_ac = 1;
  local_7c = 0;
  local_a8 = 1;
  local_a4 = 1;
  init_atoms();
  iVar2 = INT_CMCondition_get(conn->cm,conn);
  cm = conn->cm;
  iVar3 = get_long_attr(how,CM_TRANS_TEST_SIZE,&local_a0);
  if (iVar3 == 0) {
    puts("CM_TRANS_TEST_SIZE attr not found by CMtest_transport, required");
    return (attr_list)0x0;
  }
  get_int_attr(how,CM_TRANS_TEST_VECS,&local_ac);
  if ((int)local_ac < 1) {
    printf("Stupid vecs value in CMtest_transport, %d\n");
    return (attr_list)0x0;
  }
  if (((float)(long)local_a0 / (float)(int)local_ac < 24.0) && (local_ac = 1, (long)local_a0 < 0x18)
     ) {
    local_a0 = 0x18;
  }
  get_int_attr(how,CM_TRANS_TEST_VERBOSE,&local_7c);
  get_int_attr(how,CM_TRANS_TEST_REPEAT,&local_a8);
  get_int_attr(how,CM_TRANS_TEST_REUSE_WRITE_BUFFER,&local_a4);
  get_int_attr(how,CM_TRANS_TEST_NODE,&local_80);
  pcVar5 = (char *)attr_list_to_string(how);
  sVar6 = strlen(pcVar5);
  lVar13 = (sVar6 << 0x20) + 0x1900000000;
  local_78 = 0x434d5000;
  uVar14 = 0xfa000000;
  if (lVar13 < 0) {
    uVar14 = 0xfaffffff;
  }
  local_74 = CONCAT44((int)((ulong)lVar13 >> 0x20),uVar14);
  local_68 = 0x18;
  local_6c = iVar2;
  INT_CMCondition_set_client_data(conn->cm,iVar2,&local_98);
  iVar3 = CMtrace_val[5];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(conn->cm,CMTransportVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar16 = (FILE *)conn->cm->CMTrace_file;
      _Var4 = getpid();
      pVar12 = pthread_self();
      fprintf(pFVar16,"P%lxT%lx - ",(long)_Var4,pVar12);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,
            "CM - Initiating transport test of %zd bytes, %d messages\n",local_a0,(ulong)local_a8);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  iVar3 = CMtrace_val[5];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(conn->cm,CMTransportVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar16 = (FILE *)conn->cm->CMTrace_file;
      _Var4 = getpid();
      pVar12 = pthread_self();
      fprintf(pFVar16,"P%lxT%lx - ",(long)_Var4,pVar12);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fwrite("CM - transport test, sending first message\n",0x2b,1,(FILE *)conn->cm->CMTrace_file);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  pFVar7 = (FFSEncodeVector)INT_CMmalloc((long)(int)local_ac * 0x10 + 0x10);
  pFVar7->iov_base = &local_78;
  pFVar7->iov_len = 0x18;
  pFVar7[1].iov_base = pcVar5;
  sVar6 = strlen(pcVar5);
  pFVar7[1].iov_len = sVar6 + 1;
  iVar3 = INT_CMwrite_raw(conn,pFVar7,(FFSEncodeVector)0x0,2,sVar6 + 0x19,(attr_list)0x0,1);
  free(pcVar5);
  if (iVar3 != 1) {
LAB_00125fda:
    free(pFVar7);
    return (attr_list)0x0;
  }
  sVar8 = (long)(local_a0 + (long)(int)local_ac + -1) / (long)(int)local_ac;
  __ptr = pFVar7;
  local_84 = iVar2;
  if ((int)local_a8 < 1) {
LAB_00125f4f:
    local_74 = 0x18fc000000;
    full_vec = (FFSEncodeVector)INT_CMmalloc(0x10);
  }
  else {
    iVar2 = 0;
    pFVar15 = (FFSEncodeVector)0x0;
    local_58 = cm;
    local_50 = pFVar7;
    local_48 = conn;
    do {
      full_vec = pFVar15;
      if (pFVar15 == (FFSEncodeVector)0x0) {
        local_90 = (FFSEncodeVector)INT_CMmalloc((long)(int)local_ac * 0x10 + 0x20);
        uVar1 = local_ac;
        local_90->iov_len = 0x14;
        uVar17 = (ulong)(int)local_ac;
        if (0 < (long)uVar17) {
          lVar13 = (long)(int)local_a8;
          psVar18 = &local_90[1].iov_len;
          uVar19 = uVar17;
          do {
            pvVar9 = calloc(lVar13 + sVar8,1);
            pFVar7 = local_90;
            ((FFSEncodeVec *)(psVar18 + -1))->iov_base = pvVar9;
            *psVar18 = sVar8;
            psVar18 = psVar18 + 2;
            uVar19 = uVar19 - 1;
          } while (uVar19 != 0);
          if (0 < (int)uVar1) {
            uVar19 = (ulong)local_a8;
            lVar13 = 0;
            do {
              if (3 < (long)(int)uVar19 + sVar8) {
                uVar17 = 0;
                do {
                  iVar3 = rand();
                  *(int *)((long)pFVar7[lVar13 + 1].iov_base + uVar17 * 4) = iVar3;
                  uVar17 = uVar17 + 1;
                  uVar19 = (ulong)(int)local_a8;
                } while (uVar17 < uVar19 + sVar8 >> 2);
                uVar17 = (ulong)local_ac;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < (int)uVar17);
          }
        }
        sVar10 = local_90[1].iov_len - local_90->iov_len;
        if (local_90[1].iov_len < local_90->iov_len || sVar10 == 0) {
          sVar10 = 1;
        }
        local_90[1].iov_len = sVar10;
        full_vec = local_90;
        conn = local_48;
        __ptr = local_50;
      }
      puVar11 = (undefined4 *)INT_CMmalloc(0x14);
      full_vec->iov_base = puVar11;
      *puVar11 = 0x434d5000;
      puVar11[1] = (uint)(local_a0 >> 0x20) & 0xffffff | 0xfb000000;
      puVar11[2] = (int)local_a0;
      puVar11[3] = iVar2;
      puVar11[4] = local_80;
      lVar13 = (long)(int)local_ac;
      if (1 < lVar13) {
        full_vec[lVar13].iov_len = local_a0 - (local_ac - 1) * sVar8;
      }
      pFVar7 = (FFSEncodeVector)INT_CMmalloc(lVar13 * 0x10 + 0x20);
      memcpy(pFVar7,full_vec,(long)(int)local_ac * 0x10 + 0x20);
      pvVar9 = INT_CMmalloc(0x20);
      *(FFSEncodeVector *)((long)pvVar9 + 8) = pFVar7;
      if ((iVar2 == local_a8 - 1) || (local_a4 == 0)) {
        *(uint *)((long)pvVar9 + 0x10) = local_ac;
        pFVar15 = full_vec;
      }
      else {
        pFVar15 = (FFSEncodeVector)0x0;
      }
      *(FFSEncodeVector *)((long)pvVar9 + 0x18) = pFVar15;
      iVar3 = INT_CMwrite_raw_notify
                        (conn,pFVar7,(FFSEncodeVector)0x0,(long)(int)local_ac + 1,local_a0,
                         (attr_list)0x0,0,write_is_done,pvVar9);
      pFVar15 = (FFSEncodeVector)0x0;
      if (local_a4 != 0) {
        pFVar15 = full_vec;
      }
      if (iVar2 == local_a8 - 1) {
        pFVar15 = (FFSEncodeVector)0x0;
      }
      pFVar7 = pFVar15;
      if (iVar3 != 1) goto LAB_00125fda;
      if (conn->write_pending != 0) {
        wait_for_pending_write(conn);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < (int)local_a8);
    local_74 = 0x18fc000000;
    cm = local_58;
    if (pFVar15 == (FFSEncodeVector)0x0) goto LAB_00125f4f;
  }
  full_vec->iov_base = &local_78;
  full_vec->iov_len = 0x18;
  iVar2 = INT_CMwrite_raw(conn,full_vec,(FFSEncodeVector)0x0,1,0x18,(attr_list)0x0,0);
  free(full_vec);
  free(__ptr);
  if (iVar2 != 1) {
    return (attr_list)0x0;
  }
  iVar2 = INT_CMCondition_wait(conn->cm,local_84);
  if (iVar2 == 0) {
    iVar2 = CMtrace_val[5];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(cm,CMTransportVerbose);
    }
    if (iVar2 == 0) goto LAB_0012615e;
    if (CMtrace_PID != 0) {
      pFVar16 = (FILE *)cm->CMTrace_file;
      _Var4 = getpid();
      pVar12 = pthread_self();
      fprintf(pFVar16,"P%lxT%lx - ",(long)_Var4,pVar12);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    pFVar16 = (FILE *)cm->CMTrace_file;
    pcVar5 = "CM - Completed transport test CONNECTION FAILED- result %p \n";
  }
  else {
    iVar2 = CMtrace_val[5];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(cm,CMTransportVerbose);
    }
    if (iVar2 == 0) goto LAB_0012615e;
    if (CMtrace_PID != 0) {
      pFVar16 = (FILE *)cm->CMTrace_file;
      _Var4 = getpid();
      pVar12 = pthread_self();
      fprintf(pFVar16,"P%lxT%lx - ",(long)_Var4,pVar12);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    pFVar16 = (FILE *)cm->CMTrace_file;
    pcVar5 = "CM - Completed transport test - result %p \n";
  }
  fprintf(pFVar16,pcVar5,local_98);
LAB_0012615e:
  fflush((FILE *)cm->CMTrace_file);
  return local_98;
}

Assistant:

extern attr_list
INT_CMtest_transport(CMConnection conn, attr_list how)
{
    int i;
    int cond;
    attr_list result = NULL;
    long actual;
    struct FFSEncodeVec *write_vec;
    struct FFSEncodeVec *tmp_vec, *header_vec;
    int header[6];
    ssize_t size;
    int vecs = 1;
    int verbose = 0;
    int repeat_count = 1;
    int reuse_write_buffer = 1;
    long start_size, count;
    init_atoms();
    cond = INT_CMCondition_get(conn->cm, conn);
    CManager cm = conn->cm;
    struct _free_struct *write_data;
    int node_id;

    if (!get_long_attr(how, CM_TRANS_TEST_SIZE, &size)) {
	printf("CM_TRANS_TEST_SIZE attr not found by CMtest_transport, required\n");
	return 0;
    }
    get_int_attr(how, CM_TRANS_TEST_VECS, &vecs);
    if (vecs < 1) {
	printf("Stupid vecs value in CMtest_transport, %d\n", vecs);
	return 0;
    }
    if (((float)size / (float) vecs) < 24.0) {
      vecs = 1;
      if (size < 24) {
	size = 24;
      }
    }
    get_int_attr(how, CM_TRANS_TEST_VERBOSE, &verbose);
    get_int_attr(how, CM_TRANS_TEST_REPEAT, &repeat_count);
    get_int_attr(how, CM_TRANS_TEST_REUSE_WRITE_BUFFER, &reuse_write_buffer);
    get_int_attr(how, CM_TRANS_TEST_NODE, &node_id);
    char *attr_str = attr_list_to_string(how);

    
    start_size = (int)strlen(attr_str) + (int)sizeof(header) + 1;
    /* CMP\0 in first entry for CMPerformance message */
    ((int*)header)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
    ((int*)header)[1] = (CMPerfTestInit<<24);
#else
    ((int*)header)[1] = ((start_size >> 32) &0xffffff) | (CMPerfTestInit<<24);
#endif
    ((int*)header)[2] = (start_size & 0xffffffff);
    ((int*)header)[3] = cond;   /* condition value in third entry */
    ((int*)header)[4] = sizeof(header);   /* header size 4th entry */
    ((int*)header)[5] = 0;
    INT_CMCondition_set_client_data( conn->cm, cond, &result);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Initiating transport test of %zd bytes, %d messages\n", size, repeat_count);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - transport test, sending first message\n");

    header_vec = malloc(sizeof(header_vec[0]) * (vecs + 1));  /* at least 2 */
    header_vec[0].iov_base = &header[0];
    header_vec[0].iov_len = sizeof(header);
    header_vec[1].iov_base = attr_str;
    header_vec[1].iov_len = strlen(attr_str) + 1; /* send NULL */
    actual = INT_CMwrite_raw(conn, header_vec, NULL, 2, header_vec[0].iov_len + header_vec[1].iov_len, NULL, 1);
    free(attr_str);
    if (actual != 1) { 
	free(header_vec);
	return NULL;
    }

    tmp_vec = NULL;
    size_t each = (size + vecs - 1) / vecs;
    for (i=0; i <repeat_count; i++) {
	if (tmp_vec == NULL) {
	    tmp_vec = malloc(sizeof(tmp_vec[0]) * (vecs + 2));  /* at least 2 */
	    tmp_vec[0].iov_len = 5 * sizeof(int); /* body header */
	    for (count = 0; count < vecs; count++) {
		tmp_vec[count+1].iov_base = calloc(each + repeat_count, 1);
		tmp_vec[count+1].iov_len = each;
	    }
	    for (count = 0; count < vecs; count++) {
		/* for each vector, give it unique data */
		int j;
		for (j=0; j < ((each + repeat_count) /sizeof(int)); j++) {
		    ((int*)tmp_vec[count+1].iov_base)[j] = rand();
		}
	    }
	    if (tmp_vec[1].iov_len > tmp_vec[0].iov_len) {
	      tmp_vec[1].iov_len -= tmp_vec[0].iov_len;
	    } else {
	      tmp_vec[1].iov_len = 1;  /* just so there's something */
	    }
	}
	tmp_vec[0].iov_base = malloc(5 * sizeof(int)); /* body header */
	((int*)tmp_vec[0].iov_base)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
	((int*)tmp_vec[0].iov_base)[1] = (CMPerfTestBody<<24);
#else
	((int*)tmp_vec[0].iov_base)[1] = ((size >> 32) &0xffffff) | (CMPerfTestBody<<24);
#endif
	((int*)tmp_vec[0].iov_base)[2] = (size & 0xffffffff);
	((int*)tmp_vec[0].iov_base)[3] = i;   /* sequence number */
	((int*)tmp_vec[0].iov_base)[4] = node_id;   /* node_id */
	if (vecs > 1) {
	    /* if more than one vec, handle rounding */
	    tmp_vec[vecs].iov_len = size - (each * (vecs-1));
	}
	write_vec = malloc(sizeof(write_vec[0]) * (vecs + 2));  /* at least 3 */
	memcpy(write_vec, tmp_vec, sizeof(write_vec[0]) * (vecs + 2));
	for (count = 0; count < vecs; count++) {
	    /* On each iteration, increment the write base for each buffer by 1 */
//	    write_vec[count+1].iov_base += i;
	}
	write_data = malloc(sizeof(struct _free_struct));
	write_data->write_vec = write_vec;
	if ((i == (repeat_count-1)) || (!reuse_write_buffer)){
	    /* free this when done */
	    write_data->tmp_vec = tmp_vec;
	    write_data->vecs = vecs;
	} else {
	    write_data->tmp_vec = NULL;
	}
	actual = INT_CMwrite_raw_notify(conn, write_vec, NULL, vecs+1, size, 
					NULL, 0, write_is_done, (void*)write_data);
	if ((i == (repeat_count-1)) || (!reuse_write_buffer)){
	    /* free this when done */
	    tmp_vec = NULL;
	}

	if (actual != 1) {
	    free(tmp_vec);
	    return NULL;
	}
	if (conn->write_pending) {
	    wait_for_pending_write(conn);
	}
    }
    ((int*)header)[1] = 0 | (CMPerfTestEnd<<24);
    ((int*)header)[2] = sizeof(header);
    if (!tmp_vec) tmp_vec = malloc(sizeof(tmp_vec[0]));
    tmp_vec[0].iov_base = &header[0];
    tmp_vec[0].iov_len = sizeof(header);
    actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, sizeof(header), NULL, 0);
    free(tmp_vec);
    free(header_vec);
    if (actual != 1) {
	return NULL;
    }

    int ret = INT_CMCondition_wait(conn->cm, cond);
    if (ret) {
      CMtrace_out(cm, CMTransportVerbose, "CM - Completed transport test - result %p \n", result);
    } else {
      CMtrace_out(cm, CMTransportVerbose, "CM - Completed transport test CONNECTION FAILED- result %p \n", result);
    }
    return result;
}